

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_refine(lysp_ctx *ctx,lysp_stmt *stmt,lysp_refine **refines)

{
  long *plVar1;
  lysp_ext_instance **exts;
  ly_stmt stmt_00;
  lysp_refine *plVar2;
  lysp_stmt *stmt_01;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  long *plVar7;
  long lVar8;
  char *pcVar9;
  char *format;
  uint32_t substmt_index;
  lysp_qname **qnames;
  ly_ctx *plVar10;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  uint16_t *flags;
  lysp_stmt **pplVar11;
  
  LVar5 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  plVar2 = *refines;
  if (plVar2 == (lysp_refine *)0x0) {
    plVar7 = (long *)malloc(0x58);
    if (plVar7 == (long *)0x0) goto LAB_001692fd;
    *plVar7 = 1;
    lVar8 = 1;
  }
  else {
    lVar8 = *(long *)&plVar2[-1].flags;
    *(long *)&plVar2[-1].flags = lVar8 + 1;
    plVar7 = (long *)realloc(&plVar2[-1].flags,lVar8 * 0x50 + 0x58);
    if (plVar7 == (long *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
LAB_001692fd:
      if (ctx == (lysp_ctx *)0x0) {
        plVar10 = (ly_ctx *)0x0;
      }
      else {
        plVar10 = (ly_ctx *)
                  **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar10,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_refine");
      return LY_EMEM;
    }
    lVar8 = *plVar7;
  }
  *refines = (lysp_refine *)(plVar7 + 1);
  plVar1 = plVar7 + lVar8 * 10;
  plVar1[-1] = 0;
  *plVar1 = 0;
  plVar1[-3] = 0;
  plVar1[-2] = 0;
  plVar1[-5] = 0;
  plVar1[-4] = 0;
  plVar1[-7] = 0;
  plVar1[-6] = 0;
  plVar1[-9] = 0;
  plVar1[-8] = 0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar10 = (ly_ctx *)0x0;
  }
  else {
    plVar10 = (ly_ctx *)
              **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar5 = lydict_insert(plVar10,stmt->arg,0,(char **)(plVar1 + -9));
  if (LVar5 == LY_SUCCESS) {
    flags = (uint16_t *)(plVar7 + lVar8 * 10);
    exts = (lysp_ext_instance **)(flags + -4);
    iVar4 = (int)flags;
    LVar5 = LY_SUCCESS;
    pplVar11 = &stmt->child;
    while (stmt_01 = *pplVar11, stmt_01 != (lysp_stmt *)0x0) {
      stmt_00 = stmt_01->kw;
      substmt_index = iVar4 - 0x38;
      if (stmt_00 == LY_STMT_REFERENCE) {
LAB_001694ae:
        in_R8 = exts;
        LVar6 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
      }
      else {
        qnames = (lysp_qname **)(flags + -0xc);
        if (stmt_00 == LY_STMT_DEFAULT) {
LAB_001694ff:
          LVar6 = lysp_stmt_qnames(ctx,stmt_01,qnames,(yang_arg)exts,in_R8);
        }
        else {
          substmt_index = iVar4 - 0x40;
          if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_001694ae;
          if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
            in_R8 = exts;
            LVar6 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_REFINE,0,exts);
          }
          else {
            if (stmt_00 == LY_STMT_IF_FEATURE) {
              plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              qnames = (lysp_qname **)(flags + -0x18);
              if (*(byte *)&plVar3[2].schema < 2) {
                plVar10 = (ly_ctx *)**(undefined8 **)plVar3;
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar9 = "if-feature";
LAB_001695af:
                ly_vlog(plVar10,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar9,"refine");
                return LY_EVALID;
              }
              goto LAB_001694ff;
            }
            if (stmt_00 == LY_STMT_MANDATORY) {
              LVar6 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
            }
            else if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
              in_R8 = exts;
              LVar6 = lysp_stmt_maxelements(ctx,stmt_01,(uint32_t *)(flags + -6),flags,exts);
            }
            else if (stmt_00 == LY_STMT_MIN_ELEMENTS) {
              in_R8 = exts;
              LVar6 = lysp_stmt_minelements(ctx,stmt_01,(uint32_t *)(flags + -8),flags,exts);
            }
            else if (stmt_00 == LY_STMT_MUST) {
              LVar6 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(flags + -0x14));
            }
            else {
              substmt_index = iVar4 - 0x20;
              if (stmt_00 == LY_STMT_PRESENCE) goto LAB_001694ae;
              if (stmt_00 != LY_STMT_CONFIG) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar10 = (ly_ctx *)0x0;
                }
                else {
                  plVar10 = (ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar9 = lyplg_ext_stmt2str(stmt_00);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
                goto LAB_001695af;
              }
              LVar6 = lysp_stmt_config(ctx,stmt_01,flags,exts);
            }
          }
        }
      }
      if (LVar6 != LY_SUCCESS) {
        return LVar6;
      }
      pplVar11 = &stmt_01->next;
    }
  }
  return LVar5;
}

Assistant:

static LY_ERR
lysp_stmt_refine(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &rf->nodeid));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->dsc, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->ref, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->presence, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "refine");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}